

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O2

bool __thiscall
ZAP::ArchiveBuilder::buildMemory
          (ArchiveBuilder *this,char **data,size_t *size,Compression compression)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  stringstream stream;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,_S_bin);
  bVar1 = build(this,local_198,compression);
  if (bVar1) {
    std::istream::seekg((long)&stream,_S_beg);
    sVar2 = std::istream::tellg();
    *size = sVar2;
    std::istream::seekg((long)&stream,_S_beg);
    pcVar3 = (char *)operator_new__(*size);
    *data = pcVar3;
    std::istream::read((char *)&stream,(long)pcVar3);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return bVar1;
}

Assistant:

bool ArchiveBuilder::buildMemory(char *&data, std::size_t &size, Compression compression)
	{
		std::stringstream stream(std::ios::binary);
		if (build(stream, compression))
		{
			stream.seekg(0, std::ios::end);
			size = static_cast<std::size_t>(stream.tellg());
			stream.seekg(0, std::ios::beg);

			data = new char[size];
			stream.read(data, size);

			return true;
		}
		return false;
	}